

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_quaternion rf_quaternion_from_euler(float roll,float pitch,float yaw)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  rf_quaternion rVar7;
  
  fVar1 = cosf(roll * 0.5);
  fVar2 = sinf(roll * 0.5);
  fVar3 = cosf(pitch * 0.5);
  fVar4 = sinf(pitch * 0.5);
  fVar5 = cosf(yaw * 0.5);
  fVar6 = sinf(yaw * 0.5);
  rVar7.w = fVar5 * fVar3 * fVar1 + fVar6 * fVar2 * fVar4;
  rVar7.z = fVar6 * fVar3 * fVar1 + -(fVar2 * fVar4) * fVar5;
  rVar7.y = fVar5 * fVar4 * fVar1 + fVar6 * fVar2 * fVar3;
  rVar7.x = fVar5 * fVar2 * fVar3 + fVar6 * -(fVar4 * fVar1);
  return rVar7;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_euler(float roll, float pitch, float yaw)
{
    rf_quaternion q = {0};

    float x0 = cosf(roll * 0.5f);
    float x1 = sinf(roll * 0.5f);
    float y0 = cosf(pitch * 0.5f);
    float y1 = sinf(pitch * 0.5f);
    float z0 = cosf(yaw * 0.5f);
    float z1 = sinf(yaw * 0.5f);

    q.x = x1 * y0 * z0 - x0 * y1 * z1;
    q.y = x0 * y1 * z0 + x1 * y0 * z1;
    q.z = x0 * y0 * z1 - x1 * y1 * z0;
    q.w = x0 * y0 * z0 + x1 * y1 * z1;

    return q;
}